

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

void pop3_get_message(char *buffer,char **outptr)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *message;
  size_t len;
  char **outptr_local;
  char *buffer_local;
  
  sVar1 = strlen(buffer);
  if (sVar1 < 3) {
    local_28 = buffer + sVar1;
  }
  else {
    message = (char *)(sVar1 - 2);
    local_28 = buffer + 2;
    while( true ) {
      bVar3 = true;
      if (*local_28 != ' ') {
        bVar3 = *local_28 == '\t';
      }
      pcVar2 = message;
      if (!bVar3) break;
      local_28 = local_28 + 1;
      message = message + -1;
    }
    do {
      message = pcVar2;
      pcVar2 = message + -1;
      if (message == (char *)0x0) break;
    } while ((((local_28[(long)pcVar2] == '\r') || (local_28[(long)pcVar2] == '\n')) ||
             (local_28[(long)pcVar2] == ' ')) || (local_28[(long)pcVar2] == '\t'));
    if (message != (char *)0x0) {
      local_28[(long)message] = '\0';
    }
  }
  *outptr = local_28;
  return;
}

Assistant:

static void pop3_get_message(char *buffer, char **outptr)
{
  size_t len = strlen(buffer);
  char *message = NULL;

  if(len > 2) {
    /* Find the start of the message */
    len -= 2;
    for(message = buffer + 2; *message == ' ' || *message == '\t';
        message++, len--)
      ;

    /* Find the end of the message */
    for(; len--;)
      if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
         message[len] != '\t')
        break;

    /* Terminate the message */
    if(++len) {
      message[len] = '\0';
    }
  }
  else
    /* junk input => zero length output */
    message = &buffer[len];

  *outptr = message;
}